

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

void __thiscall Sandbox::renderDone(Sandbox *this)

{
  Tracker *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  string local_98;
  string local_78;
  int local_54;
  string local_50;
  
  this_00 = &(this->uniforms).tracker;
  if ((this->uniforms).tracker.m_running == true) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"update:post_render","");
    Tracker::begin(this_00,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = isRecording();
  if (bVar2) {
    local_54 = getRecordingCount();
    vera::toString<int>(&local_98,&local_54,0,5,'0');
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_78.field_2._M_allocated_capacity = *psVar5;
      local_78.field_2._8_8_ = plVar4[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar5;
      local_78._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_78._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    onScreenshot(this,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    recordingFrameAdded();
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&this->screenshotFile);
    if (iVar3 != 0) {
      pcVar1 = (this->screenshotFile)._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + (this->screenshotFile)._M_string_length);
      onScreenshot(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&this->screenshotFile,0,(char *)(this->screenshotFile)._M_string_length,
                 0x3194fe);
    }
  }
  this->m_change = false;
  this->m_change_viewport = false;
  SceneRender::unflagChange(&this->m_sceneRender);
  Uniforms::unflagChange(&this->uniforms);
  if (this->m_plot != PLOT_OFF) {
    onPlot(this);
  }
  if (this->m_initialized == false) {
    this->m_initialized = true;
    vera::updateViewport();
    this->m_change = true;
  }
  if ((this->uniforms).tracker.m_running == true) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"update:post_render","");
    Tracker::end(this_00,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Sandbox::renderDone() {
    TRACK_BEGIN("update:post_render")

    // RECORD
    if (isRecording()) {
        onScreenshot( vera::toString( getRecordingCount() , 0, 5, '0') + ".png");
        recordingFrameAdded();
    }
    // SCREENSHOT 
    else if (screenshotFile != "") {
        onScreenshot(screenshotFile);
        screenshotFile = "";
    }

    unflagChange();

    if (m_plot != PLOT_OFF)
        onPlot();

    if (!m_initialized) {
        m_initialized = true;
        vera::updateViewport();
        flagChange();
    }

    TRACK_END("update:post_render")
}